

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * __thiscall Catch::RunContext::runTest(RunContext *this,TestCase *testCase)

{
  undefined1 uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  TestCaseInfo *this_00;
  pointer pIVar5;
  TestCaseStats *_stdOut;
  element_type *peVar6;
  undefined4 extraout_var;
  string *_stdErr;
  SectionTracker *pSVar7;
  RunContext *pRVar8;
  TestCase *in_RDX;
  long in_RSI;
  Totals *in_RDI;
  ITracker *rootTracker;
  TestCaseInfo *testInfo;
  string redirectedCerr;
  string redirectedCout;
  Totals prevTotals;
  RunContext *in_stack_fffffffffffffd90;
  Totals *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda4;
  undefined1 in_stack_fffffffffffffda5;
  byte in_stack_fffffffffffffda6;
  byte in_stack_fffffffffffffda7;
  undefined1 _aborting;
  undefined7 in_stack_fffffffffffffdc8;
  TestCaseStats *this_01;
  undefined1 local_208 [48];
  NameAndLocation *in_stack_fffffffffffffe28;
  TrackerContext *in_stack_fffffffffffffe30;
  string local_88 [32];
  string local_68 [32];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  string *redirectedCerr_00;
  string *redirectedCout_00;
  Totals *_totals;
  
  local_48 = *(undefined8 *)(in_RSI + 0xf0);
  uStack_40 = *(undefined8 *)(in_RSI + 0xf8);
  local_38 = *(undefined8 *)(in_RSI + 0x100);
  redirectedCerr_00 = *(string **)(in_RSI + 0x108);
  redirectedCout_00 = *(string **)(in_RSI + 0x110);
  pRVar8 = *(RunContext **)(in_RSI + 0x118);
  std::__cxx11::string::string(local_68);
  std::__cxx11::string::string(local_88);
  this_00 = TestCase::getTestCaseInfo(in_RDX);
  pIVar5 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x30d316);
  (*pIVar5->_vptr_IStreamingReporter[7])(pIVar5,this_00);
  *(TestCase **)(in_RSI + 0x38) = in_RDX;
  _stdOut = (TestCaseStats *)TestCaseTracking::TrackerContext::startRun(in_stack_fffffffffffffe30);
  this_01 = _stdOut;
  uVar3 = (*(((TrackerBase *)&_stdOut->_vptr_TestCaseStats)->super_ITracker)._vptr_ITracker[0xe])();
  uVar1 = (undefined1)uVar3;
  if ((uVar3 & 1) != 0) {
    peVar6 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x30d3d6);
    iVar4 = (*(peVar6->super_NonCopyable)._vptr_NonCopyable[0x13])();
    _totals = (Totals *)CONCAT44(extraout_var,iVar4);
    TestCaseTracking::SectionTracker::addInitialFilters
              ((SectionTracker *)this_01,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(uVar1,in_stack_fffffffffffffdc8));
    do {
      TestCaseTracking::TrackerContext::startCycle((TrackerContext *)in_stack_fffffffffffffd90);
      _stdErr = (string *)(in_RSI + 0x1c8);
      TestCaseTracking::NameAndLocation::NameAndLocation
                ((NameAndLocation *)
                 CONCAT17(in_stack_fffffffffffffda7,
                          CONCAT16(in_stack_fffffffffffffda6,
                                   CONCAT15(in_stack_fffffffffffffda5,
                                            CONCAT14(in_stack_fffffffffffffda4,
                                                     in_stack_fffffffffffffda0)))),
                 (string *)in_stack_fffffffffffffd98,(SourceLineInfo *)in_stack_fffffffffffffd90);
      pSVar7 = TestCaseTracking::SectionTracker::acquire
                         (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      *(SectionTracker **)(in_RSI + 0x40) = pSVar7;
      TestCaseTracking::NameAndLocation::~NameAndLocation((NameAndLocation *)0x30d477);
      _aborting = (undefined1)((ulong)pSVar7 >> 0x38);
      runCurrentTest(pRVar8,redirectedCout_00,redirectedCerr_00);
      in_stack_fffffffffffffda7 = (**(code **)(**(long **)(in_RSI + 0x40) + 0x18))();
      in_stack_fffffffffffffda6 = 0;
      if ((in_stack_fffffffffffffda7 & 1) == 0) {
        in_stack_fffffffffffffda5 = aborting(in_stack_fffffffffffffd90);
        in_stack_fffffffffffffda6 = in_stack_fffffffffffffda5 ^ 0xff;
      }
    } while ((in_stack_fffffffffffffda6 & 1) != 0);
    Totals::delta((Totals *)
                  CONCAT17(in_stack_fffffffffffffda7,
                           CONCAT16(in_stack_fffffffffffffda6,
                                    CONCAT15(in_stack_fffffffffffffda5,
                                             CONCAT14(in_stack_fffffffffffffda4,
                                                      in_stack_fffffffffffffda0)))),
                  in_stack_fffffffffffffd98);
    bVar2 = TestCaseInfo::expectedToFail(this_00);
    if ((bVar2) && ((in_RDI->testCases).passed != 0)) {
      (in_RDI->assertions).failed = (in_RDI->assertions).failed + 1;
      (in_RDI->testCases).passed = (in_RDI->testCases).passed - 1;
      (in_RDI->testCases).failed = (in_RDI->testCases).failed + 1;
    }
    Counts::operator+=((Counts *)(in_RSI + 0x110),&in_RDI->testCases);
    pRVar8 = (RunContext *)
             clara::std::
             unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
             ::operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                           *)0x30d5ab);
    aborting(pRVar8);
    TestCaseStats::TestCaseStats
              (this_01,(TestCaseInfo *)CONCAT17(uVar1,in_stack_fffffffffffffdc8),_totals,
               (string *)_stdOut,_stdErr,(bool)_aborting);
    (*(pRVar8->super_IResultCapture)._vptr_IResultCapture[0xc])(pRVar8,local_208);
    TestCaseStats::~TestCaseStats((TestCaseStats *)pRVar8);
    *(undefined8 *)(in_RSI + 0x38) = 0;
    *(undefined8 *)(in_RSI + 0x40) = 0;
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_68);
    return in_RDI;
  }
  __assert_fail("rootTracker.isSectionTracker()",
                "/workspace/llm4binary/github/license_c_cmakelists/philipp-classen[P]CppQuickCheck/test/catch.hpp"
                ,0x31d2,"Totals Catch::RunContext::runTest(const TestCase &)");
}

Assistant:

Totals RunContext::runTest(TestCase const& testCase) {
        Totals prevTotals = m_totals;

        std::string redirectedCout;
        std::string redirectedCerr;

        auto const& testInfo = testCase.getTestCaseInfo();

        m_reporter->testCaseStarting(testInfo);

        m_activeTestCase = &testCase;

        ITracker& rootTracker = m_trackerContext.startRun();
        assert(rootTracker.isSectionTracker());
        static_cast<SectionTracker&>(rootTracker).addInitialFilters(m_config->getSectionsToRun());
        do {
            m_trackerContext.startCycle();
            m_testCaseTracker = &SectionTracker::acquire(m_trackerContext, TestCaseTracking::NameAndLocation(testInfo.name, testInfo.lineInfo));
            runCurrentTest(redirectedCout, redirectedCerr);
        } while (!m_testCaseTracker->isSuccessfullyCompleted() && !aborting());

        Totals deltaTotals = m_totals.delta(prevTotals);
        if (testInfo.expectedToFail() && deltaTotals.testCases.passed > 0) {
            deltaTotals.assertions.failed++;
            deltaTotals.testCases.passed--;
            deltaTotals.testCases.failed++;
        }
        m_totals.testCases += deltaTotals.testCases;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
                                  deltaTotals,
                                  redirectedCout,
                                  redirectedCerr,
                                  aborting()));

        m_activeTestCase = nullptr;
        m_testCaseTracker = nullptr;

        return deltaTotals;
    }